

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

void __thiscall QMakeProperty::reload(QMakeProperty *this)

{
  QHash<ProKey,_ProString> *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  uint i;
  QString val;
  QString name;
  ProString *in_stack_fffffffffffffc18;
  ProString *in_stack_fffffffffffffc20;
  ProString *this_01;
  ProKey *in_stack_fffffffffffffc28;
  ProKey *key;
  QByteArrayView *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  uint local_384;
  long lVar2;
  ProString local_318;
  ProKey local_2e8 [5];
  QStringBuilder<QString_&,_const_char_(&)[5]> local_1e0;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  QStringBuilder<QString_&,_const_char_(&)[5]> local_140;
  QStringBuilder<QString_&,_const_char_(&)[5]> local_b8;
  storage_type *local_30;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = in_RDI;
  QMakeLibraryInfo::reload();
  for (local_384 = 0; local_384 < 0x17; local_384 = local_384 + 1) {
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              (in_stack_fffffffffffffc30,(char **)in_stack_fffffffffffffc28);
    QVar1.m_data = local_30;
    QVar1.m_size = (qsizetype)&local_20;
    QString::fromLatin1(QVar1);
    if ((propList[local_384].singular & 1U) == 0) {
      QMakeLibraryInfo::rawLocation((int)((ulong)lVar2 >> 0x20),(PathGroup)lVar2);
      ProString::ProString(in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->m_string);
      local_b8 = operator+(&in_stack_fffffffffffffc20->m_string,
                           (char (*) [5])in_stack_fffffffffffffc18);
      ProKey::ProKey<QString&,char_const(&)[5]>
                ((ProKey *)in_stack_fffffffffffffc20,
                 (QStringBuilder<QString_&,_const_char_(&)[5]> *)in_stack_fffffffffffffc18);
      QHash<ProKey,_ProString>::operator[]
                ((QHash<ProKey,_ProString> *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      ProString::operator=(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      ProKey::~ProKey((ProKey *)0x11ba51);
      ProString::~ProString((ProString *)0x11ba5e);
      QString::~QString((QString *)0x11ba6b);
      QMakeLibraryInfo::rawLocation((int)((ulong)lVar2 >> 0x20),(PathGroup)lVar2);
      ProString::ProString(in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->m_string);
      local_140 = operator+(&in_stack_fffffffffffffc20->m_string,
                            (char (*) [5])in_stack_fffffffffffffc18);
      ProKey::ProKey<QString&,char_const(&)[5]>
                ((ProKey *)in_stack_fffffffffffffc20,
                 (QStringBuilder<QString_&,_const_char_(&)[5]> *)in_stack_fffffffffffffc18);
      QHash<ProKey,_ProString>::operator[]
                ((QHash<ProKey,_ProString> *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      ProString::operator=(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      ProKey::~ProKey((ProKey *)0x11bb1f);
      ProString::~ProString((ProString *)0x11bb2c);
      QString::~QString((QString *)0x11bb39);
    }
    local_158 = 0xaaaaaaaaaaaaaaaa;
    local_150 = 0xaaaaaaaaaaaaaaaa;
    local_148 = 0xaaaaaaaaaaaaaaaa;
    QMakeLibraryInfo::rawLocation((int)((ulong)lVar2 >> 0x20),(PathGroup)lVar2);
    if ((propList[local_384].raw & 1U) == 0) {
      QMakeLibraryInfo::rawLocation((int)((ulong)lVar2 >> 0x20),(PathGroup)lVar2);
      ProString::ProString(in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->m_string);
      local_1e0 = operator+(&in_stack_fffffffffffffc20->m_string,
                            (char (*) [5])in_stack_fffffffffffffc18);
      ProKey::ProKey<QString&,char_const(&)[5]>
                ((ProKey *)in_stack_fffffffffffffc20,
                 (QStringBuilder<QString_&,_const_char_(&)[5]> *)in_stack_fffffffffffffc18);
      QHash<ProKey,_ProString>::operator[]
                ((QHash<ProKey,_ProString> *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      ProString::operator=(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      ProKey::~ProKey((ProKey *)0x11bc5e);
      ProString::~ProString((ProString *)0x11bc6b);
      QString::~QString((QString *)0x11bc78);
      QMakeLibraryInfo::path((int)((ulong)in_stack_fffffffffffffc28 >> 0x20));
      ProString::ProString(in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->m_string);
      ProKey::ProKey(in_stack_fffffffffffffc28,&in_stack_fffffffffffffc20->m_string);
      QHash<ProKey,_ProString>::operator[]
                ((QHash<ProKey,_ProString> *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      ProString::operator=(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      ProKey::~ProKey((ProKey *)0x11bd03);
      ProString::~ProString((ProString *)0x11bd10);
      QString::~QString((QString *)0x11bd1d);
      QString::operator+=(&in_stack_fffffffffffffc20->m_string,in_stack_fffffffffffffc38);
    }
    ProString::ProString(in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->m_string);
    ProKey::ProKey(in_stack_fffffffffffffc28,&in_stack_fffffffffffffc20->m_string);
    QHash<ProKey,_ProString>::operator[]
              ((QHash<ProKey,_ProString> *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    ProString::operator=(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    ProKey::~ProKey((ProKey *)0x11bd98);
    ProString::~ProString((ProString *)0x11bda5);
    QString::~QString((QString *)0x11bdb2);
    QString::~QString((QString *)0x11bdbf);
  }
  key = local_2e8;
  ProString::ProString(in_stack_fffffffffffffc20,in_stack_fffffffffffffc38);
  this_00 = (QHash<ProKey,_ProString> *)(in_RDI + 8);
  this_01 = &local_318;
  ProKey::ProKey((ProKey *)this_01,(char *)in_stack_fffffffffffffc18);
  QHash<ProKey,_ProString>::operator[](this_00,key);
  ProString::operator=(this_01,in_stack_fffffffffffffc18);
  ProKey::~ProKey((ProKey *)0x11be35);
  ProString::~ProString((ProString *)0x11be3f);
  ProString::ProString(this_01,in_stack_fffffffffffffc38);
  ProKey::ProKey((ProKey *)this_01,(char *)in_stack_fffffffffffffc18);
  QHash<ProKey,_ProString>::operator[](this_00,key);
  ProString::operator=(this_01,in_stack_fffffffffffffc18);
  ProKey::~ProKey((ProKey *)0x11be94);
  ProString::~ProString((ProString *)0x11be9e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeProperty::reload()
{
    QMakeLibraryInfo::reload();
    for (unsigned i = 0; i < sizeof(propList)/sizeof(propList[0]); i++) {
        QString name = QString::fromLatin1(propList[i].name);
        if (!propList[i].singular) {
            m_values[ProKey(name + "/src")] = QMakeLibraryInfo::rawLocation(
                    propList[i].loc, QMakeLibraryInfo::EffectiveSourcePaths);
            m_values[ProKey(name + "/get")] = QMakeLibraryInfo::rawLocation(
                    propList[i].loc, QMakeLibraryInfo::EffectivePaths);
        }
        QString val = QMakeLibraryInfo::rawLocation(propList[i].loc, QMakeLibraryInfo::FinalPaths);
        if (!propList[i].raw) {
            m_values[ProKey(name + "/dev")] =
                    QMakeLibraryInfo::rawLocation(propList[i].loc, QMakeLibraryInfo::DevicePaths);
            m_values[ProKey(name)] = QMakeLibraryInfo::path(propList[i].loc);
            name += "/raw";
        }
        m_values[ProKey(name)] = val;
    }
#ifdef QMAKE_VERSION_STR
    m_values["QMAKE_VERSION"] = ProString(QMAKE_VERSION_STR);
#endif
#ifdef QT_VERSION_STR
    m_values["QT_VERSION"] = ProString(QT_VERSION_STR);
#endif
}